

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfile.h
# Opt level: O0

size_t __thiscall CVmFile::read_str_byte_prefix(CVmFile *this,char *buf,size_t buflen)

{
  byte bVar1;
  ulong buflen_00;
  char *in_RDX;
  CVmFile *in_RSI;
  size_t len;
  CVmFile *in_stack_ffffffffffffffe0;
  
  bVar1 = read_byte(in_stack_ffffffffffffffe0);
  buflen_00 = (ulong)bVar1;
  if (in_RDX < (char *)(buflen_00 + 1)) {
    err_throw(0);
  }
  read_bytes(in_RSI,in_RDX,buflen_00);
  *(undefined1 *)((long)&in_RSI->fp_ + buflen_00) = 0;
  return buflen_00;
}

Assistant:

size_t read_str_byte_prefix(char *buf, size_t buflen)
    {
        size_t len = read_byte();
        if (len+1 > buflen)
            err_throw(VMERR_READ_FILE);

        read_bytes(buf, len);
        buf[len] = '\0';
        return len;
    }